

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-read-stop-start.c
# Opt level: O2

void on_connection(uv_stream_t *server,int status)

{
  int iVar1;
  char *pcVar2;
  undefined8 uStack_10;
  
  if (status == 0) {
    iVar1 = uv_tcp_init(server->loop,&connection);
    if (iVar1 == 0) {
      iVar1 = uv_accept(server,&connection);
      if (iVar1 == 0) {
        iVar1 = uv_read_start(&connection,on_alloc,on_read1);
        if (iVar1 == 0) {
          return;
        }
        pcVar2 = "0 == uv_read_start((uv_stream_t*)&connection, on_alloc, on_read1)";
        uStack_10 = 0x5f;
      }
      else {
        pcVar2 = "0 == uv_accept(server, (uv_stream_t* )&connection)";
        uStack_10 = 0x5d;
      }
    }
    else {
      pcVar2 = "0 == uv_tcp_init(server->loop, &connection)";
      uStack_10 = 0x5b;
    }
  }
  else {
    pcVar2 = "0 == status";
    uStack_10 = 0x59;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tcp-read-stop-start.c"
          ,uStack_10,pcVar2);
  abort();
}

Assistant:

static void on_connection(uv_stream_t* server, int status) {
  ASSERT(0 == status);

  ASSERT(0 == uv_tcp_init(server->loop, &connection));

  ASSERT(0 == uv_accept(server, (uv_stream_t* )&connection));

  ASSERT(0 == uv_read_start((uv_stream_t*)&connection, on_alloc, on_read1));
}